

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

void end_session_with_error
               (SESSION_INSTANCE *session_instance,char *condition_value,char *description)

{
  int iVar1;
  ERROR_HANDLE error;
  
  error = error_create(condition_value);
  if (error == (ERROR_HANDLE)0x0) {
    session_set_state(session_instance,SESSION_STATE_DISCARDING);
    connection_close(session_instance->connection,"amqp:internal-error",
                     "Cannot allocate error handle to end session",(AMQP_VALUE)0x0);
    return;
  }
  iVar1 = error_set_description(error,description);
  if (iVar1 == 0) {
    iVar1 = send_end_frame(session_instance,error);
    if (iVar1 == 0) {
      session_set_state(session_instance,SESSION_STATE_DISCARDING);
      goto LAB_0011b06a;
    }
  }
  session_set_state(session_instance,SESSION_STATE_DISCARDING);
  connection_close(session_instance->connection,"amqp:internal-error",
                   "Cannot allocate error handle to end session",(AMQP_VALUE)0x0);
LAB_0011b06a:
  error_destroy(error);
  return;
}

Assistant:

static void end_session_with_error(SESSION_INSTANCE* session_instance, const char* condition_value, const char* description)
{
    ERROR_HANDLE error_handle = error_create(condition_value);
    if (error_handle == NULL)
    {
        /* fatal error */
        session_set_state(session_instance, SESSION_STATE_DISCARDING);
        (void)connection_close(session_instance->connection, "amqp:internal-error", "Cannot allocate error handle to end session", NULL);
    }
    else
    {
        if ((error_set_description(error_handle, description) != 0) ||
            (send_end_frame(session_instance, error_handle) != 0))
        {
            /* fatal error */
            session_set_state(session_instance, SESSION_STATE_DISCARDING);
            (void)connection_close(session_instance->connection, "amqp:internal-error", "Cannot allocate error handle to end session", NULL);
        }
        else
        {
            session_set_state(session_instance, SESSION_STATE_DISCARDING);
        }

        error_destroy(error_handle);
    }
}